

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

void cs_impl::hash_map_cs_ext::insert(hash_map *map,var *key,var *val)

{
  size_t sVar1;
  any *in_RDI;
  any *in_stack_ffffffffffffff68;
  any *in_stack_ffffffffffffff70;
  EVP_PKEY_CTX *pEVar2;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *in_stack_ffffffffffffff80;
  key_arg<cs_impl::any> *in_stack_ffffffffffffff88;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *in_stack_ffffffffffffff90;
  EVP_PKEY_CTX local_58 [8];
  EVP_PKEY_CTX local_50 [7];
  undefined1 in_stack_ffffffffffffffb7;
  any *in_stack_ffffffffffffffb8;
  any *in_stack_ffffffffffffffc0;
  EVP_PKEY_CTX local_28 [8];
  EVP_PKEY_CTX local_20 [24];
  any *local_8;
  
  local_8 = in_RDI;
  sVar1 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
          ::count<cs_impl::any>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (sVar1 == 0) {
    pEVar2 = (EVP_PKEY_CTX *)&stack0xffffffffffffffb8;
    any::any(local_8,in_stack_ffffffffffffff68);
    cs::copy((EVP_PKEY_CTX *)&stack0xffffffffffffffc0,pEVar2);
    any::any(local_8,in_stack_ffffffffffffff68);
    cs::copy(local_50,local_58);
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
    ::emplace<cs_impl::any,_cs_impl::any,_0>(in_stack_ffffffffffffff80,(any *)pEVar2,local_8);
    any::~any((any *)0x4312b5);
    any::~any((any *)0x4312bf);
    any::~any((any *)0x4312c9);
    any::~any((any *)0x4312d3);
  }
  else {
    phmap::priv::
    raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
    ::at<cs_impl::any,phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>>
              ((raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    pEVar2 = local_28;
    any::any(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    cs::copy(local_20,pEVar2);
    any::swap(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
    any::~any((any *)0x4311f0);
    any::~any((any *)0x4311fa);
  }
  return;
}

Assistant:

void insert(hash_map &map, const var &key, const var &val)
		{
			if (map.count(key) > 0)
				map.at(key).swap(copy(val), true);
			else
				map.emplace(copy(key), copy(val));
		}